

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O1

int surv0_pipe_start(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  uint16_t uVar2;
  int iVar3;
  
  lVar1 = *(long *)((long)arg + 8);
  uVar2 = nni_pipe_peer(*arg);
  if (uVar2 == 99) {
    mtx = (nni_mtx *)(lVar1 + 0x20);
    nni_mtx_lock(mtx);
    nni_list_append((nni_list *)(lVar1 + 8),arg);
    nni_mtx_unlock(mtx);
    nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x230));
    iVar3 = 0;
  }
  else {
    uVar2 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar2,99);
    iVar3 = 0xd;
  }
  return iVar3;
}

Assistant:

static int
surv0_pipe_start(void *arg)
{
	surv0_pipe *p = arg;
	surv0_sock *s = p->sock;

	if (nni_pipe_peer(p->pipe) != SURVEYOR0_PEER) {
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), SURVEYOR0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->mtx);
	nni_list_append(&s->pipes, p);
	nni_mtx_unlock(&s->mtx);

	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}